

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase336::run(TestCase336 *this)

{
  uint *puVar1;
  undefined8 uVar2;
  long lVar3;
  Fault f;
  Array<unsigned_int> bar;
  int local_40 [2];
  uint *local_38;
  undefined8 uStack_30;
  undefined8 *local_28;
  
  lVar3 = 0;
  local_38 = (uint *)_::HeapArrayDisposer::allocateImpl
                               (4,0,4,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  do {
    *(int *)((long)local_38 + lVar3) =
         *(int *)((long)&DAT_0018a130 + lVar3) * *(int *)((long)&DAT_0018a130 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  uStack_30 = 4;
  local_28 = &_::HeapArrayDisposer::instance;
  if ((*local_38 != 1) && (_::Debug::minSeverity < 3)) {
    local_40[0] = 1;
    _::Debug::log<char_const(&)[33],int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x154,ERROR,"\"failed: expected \" \"(1) == (bar[0])\", 1, bar[0]",
               (char (*) [33])"failed: expected (1) == (bar[0])",local_40,local_38);
  }
  if ((local_38[1] != 4) && (_::Debug::minSeverity < 3)) {
    local_40[0] = 4;
    _::Debug::log<char_const(&)[33],int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x155,ERROR,"\"failed: expected \" \"(4) == (bar[1])\", 4, bar[1]",
               (char (*) [33])"failed: expected (4) == (bar[1])",local_40,local_38 + 1);
  }
  if ((local_38[2] != 9) && (_::Debug::minSeverity < 3)) {
    local_40[0] = 9;
    _::Debug::log<char_const(&)[33],int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x156,ERROR,"\"failed: expected \" \"(9) == (bar[2])\", 9, bar[2]",
               (char (*) [33])"failed: expected (9) == (bar[2])",local_40,local_38 + 2);
  }
  if ((local_38[3] != 0x10) && (_::Debug::minSeverity < 3)) {
    local_40[0] = 0x10;
    _::Debug::log<char_const(&)[34],int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x157,ERROR,"\"failed: expected \" \"(16) == (bar[3])\", 16, bar[3]",
               (char (*) [34])"failed: expected (16) == (bar[3])",local_40,local_38 + 3);
  }
  uVar2 = uStack_30;
  puVar1 = local_38;
  if (local_38 != (uint *)0x0) {
    local_38 = (uint *)0x0;
    uStack_30 = 0;
    (**(code **)*local_28)(local_28,puVar1,4,uVar2,uVar2,0);
  }
  return;
}

Assistant:

TEST(Array, MapRawArray) {
  uint foo[4] = {1, 2, 3, 4};
  Array<uint> bar = KJ_MAP(i, foo) -> uint { return i * i; };
  ASSERT_EQ(4, bar.size());
  EXPECT_EQ(1, bar[0]);
  EXPECT_EQ(4, bar[1]);
  EXPECT_EQ(9, bar[2]);
  EXPECT_EQ(16, bar[3]);
}